

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O0

void csp_send(csp_conn_t *conn,csp_packet_t *packet)

{
  int iVar1;
  void *in_RSI;
  long in_RDI;
  csp_packet_t *in_stack_00000018;
  csp_id_t_conflict *in_stack_00000020;
  csp_packet_t *in_stack_00000030;
  csp_conn_t *in_stack_00000038;
  
  if (in_RSI != (void *)0x0) {
    if ((in_RDI == 0) || (*(int *)(in_RDI + 4) != 1)) {
      csp_buffer_free(in_RSI);
    }
    else if (((*(byte *)(in_RDI + 0x11) & 2) == 0) ||
            (iVar1 = csp_rdp_send(in_stack_00000038,in_stack_00000030), iVar1 == 0)) {
      csp_send_direct(in_stack_00000020,in_stack_00000018,(csp_iface_t *)conn);
    }
    else {
      csp_buffer_free(in_RSI);
    }
  }
  return;
}

Assistant:

void csp_send(csp_conn_t * conn, csp_packet_t * packet) {

	if (packet == NULL) {
		return;
	}

	if ((conn == NULL) || (conn->state != CONN_OPEN)) {
		csp_buffer_free(packet);
		return;
	}

#if (CSP_USE_RDP)
	if (conn->idout.flags & CSP_FRDP) {
		if (csp_rdp_send(conn, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return;
		}
	}
#endif

	csp_send_direct(&conn->idout, packet, NULL);

}